

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointSendMessage(HelicsEndpoint endpoint,HelicsMessage message,HelicsError *err)

{
  EndpointObject *pEVar1;
  Message *pMVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(endpoint,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    pMVar2 = getMessageObj(message,err);
    if (pMVar2 != (Message *)0x0) {
      helics::Endpoint::send(pEVar1->endPtr,(int)pMVar2,__buf,in_RCX,in_R8D);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendMessage(HelicsEndpoint endpoint, HelicsMessage message, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        endObj->endPtr->send(*mess);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}